

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ScanRegExpConstant
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,ArenaAllocator *alloc)

{
  ScriptContext *scriptContext;
  size_t sVar1;
  DebugWriter *standardChars_00;
  StandardChars<char16_t> *standardEncodedChars_00;
  StandardChars<unsigned_char> *ctAllocator_00;
  bool bVar2;
  tokens tVar3;
  ThreadContext *pTVar4;
  RegexStatsDatabase *this_00;
  size_t sVar5;
  RegexPattern *local_140;
  RegexPattern *pattern;
  ParseError e;
  undefined1 local_110 [8];
  Parser<UTF8EncodingPolicyBase<false>,_true> parser;
  CharCount local_50;
  CharCount CStack_4c;
  RegexFlags flags;
  charcount_t bodyLen;
  charcount_t totalChars;
  charcount_t bodyChars;
  charcount_t totalLen;
  Node *root;
  DebugWriter *w;
  StandardChars<char16_t> *standardChars;
  StandardChars<unsigned_char> *standardEncodedChars;
  ArenaAllocator *ctAllocator;
  ArenaAllocator *alloc_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  ctAllocator = alloc;
  alloc_local = (ArenaAllocator *)this;
  pTVar4 = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  ThreadContext::ProbeStackNoDispose(pTVar4,0x6000,this->m_scriptContext,(PVOID)0x0);
  Js::ScriptContext::ProfileBegin(this->m_scriptContext,RegexCompilePhase);
  standardEncodedChars = (StandardChars<unsigned_char> *)ctAllocator;
  pTVar4 = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  standardChars = (StandardChars<char16_t> *)ThreadContext::GetStandardChars(pTVar4,(uint8 *)0x0);
  pTVar4 = Js::ScriptContext::GetThreadContext(this->m_scriptContext);
  w = (DebugWriter *)ThreadContext::GetStandardChars(pTVar4,(char16 *)0x0);
  root = (Node *)0x0;
  if ((DAT_01ec73da & 1) != 0) {
    root = (Node *)Js::ScriptContext::GetRegexDebugWriter(this->m_scriptContext);
  }
  if ((DAT_01ec73d9 & 1) != 0) {
    this_00 = Js::ScriptContext::GetRegexStatsDatabase(this->m_scriptContext);
    UnifiedRegex::RegexStatsDatabase::BeginProfile(this_00);
  }
  ctAllocator_00 = standardEncodedChars;
  standardEncodedChars_00 = standardChars;
  standardChars_00 = w;
  _bodyChars = (Node *)0x0;
  totalChars = 0;
  bodyLen = 0;
  CStack_4c = 0;
  local_50 = 0;
  parser.deferredIfUnicodeError._7_1_ = NoRegexFlags;
  scriptContext = this->m_scriptContext;
  bVar2 = UTF8EncodingPolicyBase<false>::IsUtf8(&this->super_UTF8EncodingPolicyBase<false>);
  UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::Parser
            ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_110,scriptContext,
             (ArenaAllocator *)ctAllocator_00,
             (StandardChars<unsigned_char> *)standardEncodedChars_00,
             (StandardChars<char16_t> *)standardChars_00,bVar2,(DebugWriter *)root);
  _bodyChars = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::ParseLiteral
                         ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_110,
                          this->m_currentCharacter,this->m_pchLast,&local_50,&totalChars,&bodyLen,
                          &stack0xffffffffffffffb4,
                          (RegexFlags *)((long)&parser.deferredIfUnicodeError + 7));
  bVar2 = Parser::IsBackgroundParser(this->m_parser);
  if (bVar2) {
    local_140 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<false>
                          ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_110,_bodyChars,
                           &this->m_currentCharacter,totalChars,bodyLen,local_50,CStack_4c,
                           parser.deferredIfUnicodeError._7_1_);
  }
  else {
    local_140 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::CompileProgram<true>
                          ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_110,_bodyChars,
                           &this->m_currentCharacter,totalChars,bodyLen,local_50,CStack_4c,
                           parser.deferredIfUnicodeError._7_1_);
  }
  sVar1 = (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits;
  sVar5 = UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_true>::GetMultiUnits
                    ((Parser<UTF8EncodingPolicyBase<false>,_true> *)local_110);
  UTF8EncodingPolicyBase<false>::RestoreMultiUnits
            (&this->super_UTF8EncodingPolicyBase<false>,sVar1 + sVar5);
  tVar3 = Token::SetRegex((Token *)this->m_ptoken,local_140,this->m_parser);
  return tVar3;
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanRegExpConstant(ArenaAllocator* alloc)
{
    PROBE_STACK_NO_DISPOSE(m_scriptContext, Js::Constants::MinStackRegex);

    // SEE ALSO: RegexHelper::PrimCompileDynamic()

#ifdef PROFILE_EXEC
    m_scriptContext->ProfileBegin(Js::RegexCompilePhase);
#endif
    ArenaAllocator* ctAllocator = alloc;
    UnifiedRegex::StandardChars<EncodedChar>* standardEncodedChars = m_scriptContext->GetThreadContext()->GetStandardChars((EncodedChar*)0);
    UnifiedRegex::StandardChars<char16>* standardChars = m_scriptContext->GetThreadContext()->GetStandardChars((char16*)0);
#if ENABLE_REGEX_CONFIG_OPTIONS
    UnifiedRegex::DebugWriter *w = 0;
    if (REGEX_CONFIG_FLAG(RegexDebug))
        w = m_scriptContext->GetRegexDebugWriter();
    if (REGEX_CONFIG_FLAG(RegexProfile))
        m_scriptContext->GetRegexStatsDatabase()->BeginProfile();
#endif
    UnifiedRegex::Node* root = 0;
    charcount_t totalLen = 0, bodyChars = 0, totalChars = 0, bodyLen = 0;
    UnifiedRegex::RegexFlags flags = UnifiedRegex::NoRegexFlags;
    UnifiedRegex::Parser<EncodingPolicy, true> parser
            ( m_scriptContext
            , ctAllocator
            , standardEncodedChars
            , standardChars
            , this->IsUtf8()
#if ENABLE_REGEX_CONFIG_OPTIONS
            , w
#endif
            );
    try
    {
        root = parser.ParseLiteral(m_currentCharacter, m_pchLast, bodyLen, totalLen, bodyChars, totalChars, flags);
    }
    catch (UnifiedRegex::ParseError e)
    {
#ifdef PROFILE_EXEC
        m_scriptContext->ProfileEnd(Js::RegexCompilePhase);
#endif
        m_currentCharacter += e.encodedPos;
        Error(e.error);
    }

    UnifiedRegex::RegexPattern* pattern;
    if (m_parser->IsBackgroundParser())
    {
        // Avoid allocating pattern from recycler on background thread. The main thread will create the pattern
        // and hook it to this parse node.
        pattern = parser.template CompileProgram<false>(root, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, flags);
    }
    else
    {
        pattern = parser.template CompileProgram<true>(root, m_currentCharacter, totalLen, bodyChars, bodyLen, totalChars, flags);
    }
    this->RestoreMultiUnits(this->m_cMultiUnits + parser.GetMultiUnits()); // m_currentCharacter changed, sync MultiUnits

    return m_ptoken->SetRegex(pattern, m_parser);
}